

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O3

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ssize_t sVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  long lVar4;
  size_t sVar5;
  void *pvVar6;
  undefined4 in_register_00000034;
  void *__src;
  ulong __new_size;
  size_t sVar7;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  if (this->m_pStream == (ostream *)0x0) {
    __new_size = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    uVar3 = (long)__buf + this->m_pos + 1;
    if (__new_size <= uVar3) {
      __new_size = uVar3;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,__new_size);
    if (__buf == (void *)0x0) {
      return extraout_RAX;
    }
    memmove((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + this->m_pos,__src,(size_t)__buf);
  }
  else {
    sVar2 = std::ostream::write((char *)this->m_pStream,(long)__src);
    if (__buf == (void *)0x0) {
      return sVar2;
    }
  }
  sVar7 = this->m_col;
  sVar5 = this->m_row;
  lVar4 = this->m_pos + 1;
  pvVar6 = (void *)0x0;
  do {
    cVar1 = *(char *)((long)__src + (long)pvVar6);
    this->m_pos = lVar4 + (long)pvVar6;
    sVar7 = sVar7 + 1;
    this->m_col = sVar7;
    if (cVar1 == '\n') {
      sVar5 = sVar5 + 1;
      this->m_row = sVar5;
      this->m_col = 0;
      this->m_comment = false;
      sVar7 = 0;
    }
    pvVar6 = (void *)((long)pvVar6 + 1);
  } while (__buf != pvVar6);
  return lVar4;
}

Assistant:

void ostream_wrapper::write(const char* str, std::size_t size) {
  if (m_pStream) {
    m_pStream->write(str, size);
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + size + 1));
    std::copy(str, str + size, m_buffer.begin() + m_pos);
  }

  for (std::size_t i = 0; i < size; i++) {
    update_pos(str[i]);
  }
}